

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDict
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          *out_dict)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  string local_3b8;
  ostringstream local_398 [8];
  ostringstream ss_e_1;
  string local_218;
  ostringstream local_1f8 [8];
  ostringstream ss_e;
  undefined1 local_80 [8];
  MetaVariable var;
  string key;
  char c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *out_dict_local;
  AsciiParser *this_local;
  
  bVar1 = Expect(this,'{');
  if (bVar1) {
    bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0058be2b:
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
          break;
        }
        bVar1 = Char1(this,key.field_2._M_local_buf + 0xf);
        if (!bVar1) {
          this_local._7_1_ = 0;
          break;
        }
        if (key.field_2._M_local_buf[0xf] == '}') goto LAB_0058be2b;
        bVar1 = Rewind(this,1);
        if (!bVar1) {
          this_local._7_1_ = 0;
          break;
        }
        ::std::__cxx11::string::string((string *)(var._name.field_2._M_local_buf + 8));
        MetaVariable::MetaVariable((MetaVariable *)local_80);
        bVar1 = ParseDictElement(this,(string *)((long)&var._name.field_2 + 8),
                                 (MetaVariable *)local_80);
        if (bVar1) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (bVar1) {
            bVar1 = MetaVariable::is_valid((MetaVariable *)local_80);
            if (bVar1) {
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                        ::operator[](out_dict,(key_type *)((long)&var._name.field_2 + 8));
              MetaVariable::operator=(this_00,(MetaVariable *)local_80);
              bVar1 = false;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_398);
              poVar2 = ::std::operator<<((ostream *)local_398,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ParseDict");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3ca);
              ::std::operator<<(poVar2," ");
              poVar2 = ::std::operator<<((ostream *)local_398,
                                         "Invalid Dict element(probably internal issue).");
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_3b8);
              ::std::__cxx11::string::~string((string *)&local_3b8);
              this_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_398);
            }
          }
          else {
            this_local._7_1_ = 0;
            bVar1 = true;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1f8);
          poVar2 = ::std::operator<<((ostream *)local_1f8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseDict");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3c2);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_1f8,"Failed to parse dict element.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_218);
          ::std::__cxx11::string::~string((string *)&local_218);
          this_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_1f8);
        }
        MetaVariable::~MetaVariable((MetaVariable *)local_80);
        ::std::__cxx11::string::~string((string *)(var._name.field_2._M_local_buf + 8));
      } while (!bVar1);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseDict(std::map<std::string, MetaVariable> *out_dict) {
  // '{' comment | (type name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      MetaVariable var;
      if (!ParseDictElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse dict element.");
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      if (!var.is_valid()) {
        PUSH_ERROR_AND_RETURN("Invalid Dict element(probably internal issue).");
      }

      DCOUT("Add to dict: " << key);
      (*out_dict)[key] = var;
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  return true;
}